

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenSIMDShiftSetShift(BinaryenExpressionRef expr,BinaryenExpressionRef shiftExpr)

{
  if (expr->_id != SIMDShiftId) {
    __assert_fail("expression->is<SIMDShift>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xd23,
                  "void BinaryenSIMDShiftSetShift(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (shiftExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = shiftExpr;
    return;
  }
  __assert_fail("shiftExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xd24,
                "void BinaryenSIMDShiftSetShift(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenSIMDShiftSetShift(BinaryenExpressionRef expr,
                               BinaryenExpressionRef shiftExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDShift>());
  assert(shiftExpr);
  static_cast<SIMDShift*>(expression)->shift = (Expression*)shiftExpr;
}